

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

IWrittenFont * __thiscall
FreeTypeFaceWrapper::CreateWrittenFontObject
          (FreeTypeFaceWrapper *this,ObjectsContext *inObjectsContext,bool inFontIsToBeEmbedded)

{
  FT_Bool FVar1;
  int iVar2;
  FT_Error FVar3;
  char *__s1;
  Trace *this_00;
  WrittenFontCFF *this_01;
  FT_Bool isCID;
  FT_Bool local_29;
  
  if (this->mFace == (FT_Face)0x0) {
    this_01 = (WrittenFontCFF *)0x0;
  }
  else {
    __s1 = FT_Get_X11_Font_Format(this->mFace);
    iVar2 = strcmp(__s1,"Type 1");
    if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"CFF"), iVar2 == 0)) {
      local_29 = '\0';
      FVar3 = FT_Get_CID_Is_Internally_CID_Keyed(this->mFace,&local_29);
      FVar1 = local_29;
      if (FVar3 != 0) {
        local_29 = '\0';
      }
      this_01 = (WrittenFontCFF *)operator_new(0x560);
      WrittenFontCFF::WrittenFontCFF
                (this_01,inObjectsContext,this,FVar3 == 0 && FVar1 != '\0',inFontIsToBeEmbedded);
    }
    else {
      iVar2 = strcmp(__s1,"TrueType");
      if (iVar2 == 0) {
        this_01 = (WrittenFontCFF *)operator_new(0x40);
        WrittenFontTrueType::WrittenFontTrueType
                  ((WrittenFontTrueType *)this_01,inObjectsContext,this);
      }
      else {
        this_00 = Trace::DefaultTrace();
        this_01 = (WrittenFontCFF *)0x0;
        Trace::TraceToLog(this_00,
                          "Failure in FreeTypeFaceWrapper::CreateWrittenFontObject, could not find font writer implementation for %s"
                          ,__s1);
      }
    }
  }
  return (IWrittenFont *)this_01;
}

Assistant:

IWrittenFont* FreeTypeFaceWrapper::CreateWrittenFontObject(ObjectsContext* inObjectsContext, bool inFontIsToBeEmbedded)
{
	if(mFace)
	{
		IWrittenFont* result;
		const char* fontFormat = FT_Get_X11_Font_Format(mFace);

		if(strcmp(fontFormat,scType1) == 0 || strcmp(fontFormat,scCFF) == 0)
		{
			FT_Bool isCID = false;
			
			// CFF written fonts needs to know if the font is originally CID in order to disallow ANSI form in this case
			if(FT_Get_CID_Is_Internally_CID_Keyed(mFace,&isCID) != 0)
				isCID = false;	

			result = new WrittenFontCFF(inObjectsContext, this,isCID != 0, inFontIsToBeEmbedded); // CFF fonts should know if font is to be embedded, as the embedding code involves re-encoding of glyphs
		}
		else if(strcmp(fontFormat,scTrueType) == 0)
		{
			result = new WrittenFontTrueType(inObjectsContext, this);
		}
		else
		{
			result = NULL;
			TRACE_LOG1("Failure in FreeTypeFaceWrapper::CreateWrittenFontObject, could not find font writer implementation for %s",
				fontFormat);
		}
		return result;
	}
	else
		return NULL;	
}